

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult *
Catch::Clara::Detail::convertInto<double>
          (ParserResult *__return_storage_ptr__,string *source,double *target)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream ss;
  byte abStack_188 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)source,_S_out|_S_in);
  std::istream::_M_extract<double>((double *)&ss);
  if ((abStack_188[*(long *)(_ss + -0x18)] & 5) == 0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a7560;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(&bStack_1e8,"Unable to convert \'",source);
    std::operator+(&local_1c8,&bStack_1e8,"\' to destination type");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&bStack_1e8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto( std::string const& source, T& target ) {
                std::stringstream ss( source );
                ss >> target;
                if ( ss.fail() ) {
                    return ParserResult::runtimeError(
                        "Unable to convert '" + source +
                        "' to destination type" );
                } else {
                    return ParserResult::ok( ParseResultType::Matched );
                }
            }